

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::calculateHPageOffset(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  qpdf_offset_t qVar1;
  ulong uVar2;
  CHPageOffset *__n;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  ObjTable *this_01;
  int iVar3;
  pointer pMVar4;
  reference pvVar5;
  const_reference pvVar6;
  int *piVar7;
  reference pvVar8;
  long lVar9;
  Object *pOVar10;
  NewObject *this_02;
  pointer pHVar11;
  size_t sVar12;
  reference __x;
  value_type_conflict3 local_f4;
  ulong local_f0;
  size_t j;
  string local_e0;
  CHPageOffset *local_c0;
  size_t i_1;
  int local_a4;
  int local_a0;
  int nshared;
  int length;
  int nobjects;
  uint i;
  allocator<QPDF::HPageOffsetEntry> local_81;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> local_80;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *local_68;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *phe;
  HPageOffset *ph;
  int local_50;
  int max_shared;
  int max_length;
  int min_length;
  int max_nobjects;
  int min_nobjects;
  vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_> *cphe;
  CHPageOffset *cph;
  size_t npages;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  ObjTable *obj_local;
  NewObjTable *new_obj_local;
  QPDF *this_local;
  
  pages = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)obj;
  obj_local = (ObjTable *)new_obj;
  new_obj_local = (NewObjTable *)this;
  npages = (size_t)getAllPages(this);
  cph = (CHPageOffset *)
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)npages);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  _max_nobjects = &pMVar4->c_page_offset_data;
  cphe = &_max_nobjects->entries;
  pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                     (&_max_nobjects->entries,0);
  max_length = pvVar5->nobjects;
  min_length = max_length;
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)npages,0);
  iVar3 = QPDFObjectHandle::getObjectID(pvVar6);
  local_50 = outputLengthNextN(this,iVar3,min_length,(NewObjTable *)obj_local,(ObjTable *)pages);
  max_shared = local_50;
  pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                     (&_max_nobjects->entries,0);
  ph._4_4_ = pvVar5->nshared_objects;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __n = cph;
  phe = (vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
        &pMVar4->page_offset_hints;
  local_68 = &(pMVar4->page_offset_hints).entries;
  std::allocator<QPDF::HPageOffsetEntry>::allocator(&local_81);
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::vector
            (&local_80,(size_type)__n,&local_81);
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::operator=
            (local_68,&local_80);
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::~vector(&local_80);
  std::allocator<QPDF::HPageOffsetEntry>::~allocator(&local_81);
  for (length = 0; this_01 = obj_local, this_00 = pages, (CHPageOffset *)(ulong)(uint)length < cph;
      length = length + 1) {
    pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                       (&_max_nobjects->entries,(ulong)(uint)length);
    nshared = pvVar5->nobjects;
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)npages,
                        (ulong)(uint)length);
    iVar3 = QPDFObjectHandle::getObjectID(pvVar6);
    local_a0 = outputLengthNextN(this,iVar3,nshared,(NewObjTable *)obj_local,(ObjTable *)pages);
    pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                       (&_max_nobjects->entries,(ulong)(uint)length);
    local_a4 = pvVar5->nshared_objects;
    piVar7 = std::min<int>(&min_length,&nshared);
    min_length = *piVar7;
    piVar7 = std::max<int>(&max_length,&nshared);
    max_length = *piVar7;
    piVar7 = std::min<int>(&max_shared,&local_a0);
    max_shared = *piVar7;
    piVar7 = std::max<int>(&local_50,&local_a0);
    local_50 = *piVar7;
    piVar7 = std::max<int>((int *)((long)&ph + 4),&local_a4);
    iVar3 = nshared;
    ph._4_4_ = *piVar7;
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(ulong)(uint)length);
    pvVar8->delta_nobjects = iVar3;
    lVar9 = (long)local_a0;
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(ulong)(uint)length);
    iVar3 = local_a4;
    pvVar8->delta_page_length = lVar9;
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(ulong)(uint)length);
    pvVar8->nshared_objects = iVar3;
  }
  *(int *)&(phe->super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
           )._M_impl.super__Vector_impl_data._M_start = min_length;
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)npages,0);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&i_1,pvVar6);
  pOVar10 = ObjTable<QPDFWriter::Object>::operator[]
                      ((ObjTable<QPDFWriter::Object> *)this_00,(QPDFObjectHandle *)&i_1);
  this_02 = ObjTable<QPDFWriter::NewObject>::operator[]
                      ((ObjTable<QPDFWriter::NewObject> *)this_01,pOVar10->renumber);
  pHVar11 = (pointer)QPDFXRefEntry::getOffset(&this_02->xref);
  (phe->super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>)._M_impl
  .super__Vector_impl_data._M_finish = pHVar11;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&i_1);
  iVar3 = nbits(max_length - min_length);
  *(int *)&(phe->super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage = iVar3;
  *(int *)((long)&(phe->
                  super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = max_shared;
  iVar3 = nbits(local_50 - max_shared);
  *(int *)&phe[1].
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_start = iVar3;
  iVar3 = nbits(ph._4_4_);
  *(int *)((long)&phe[1].
                  super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = iVar3;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  iVar3 = nbits((pMVar4->c_shared_object_data).nshared_total);
  *(int *)&phe[2].
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_start = iVar3;
  *(undefined4 *)
   &phe[2].super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = 4;
  *(undefined4 *)
   &phe[1].super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
       *(undefined4 *)
        &phe[1].super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&phe[1].
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) =
       *(undefined4 *)
        ((long)&(phe->
                super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  local_c0 = (CHPageOffset *)0x0;
  do {
    if (cph <= local_c0) {
      return;
    }
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(size_type)local_c0);
    if (pvVar8->delta_nobjects < min_length) {
LAB_00373fde:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "found too small delta nobjects or delta page length while writing linearization data"
                 ,(allocator<char> *)((long)&j + 7));
      stopOnError(this,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&j + 7));
    }
    else {
      pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (local_68,(size_type)local_c0);
      if (pvVar8->delta_page_length < (long)max_shared) goto LAB_00373fde;
    }
    iVar3 = min_length;
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(size_type)local_c0);
    pvVar8->delta_nobjects = pvVar8->delta_nobjects - iVar3;
    lVar9 = (long)max_shared;
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(size_type)local_c0);
    pvVar8->delta_page_length = pvVar8->delta_page_length - lVar9;
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(size_type)local_c0);
    qVar1 = pvVar8->delta_page_length;
    pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_68,(size_type)local_c0);
    pvVar8->delta_content_length = qVar1;
    local_f0 = 0;
    while( true ) {
      uVar2 = local_f0;
      pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                         (&_max_nobjects->entries,(size_type)local_c0);
      sVar12 = toS<int>(&pvVar5->nshared_objects);
      if (sVar12 <= uVar2) break;
      pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (local_68,(size_type)local_c0);
      pvVar5 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                         (&_max_nobjects->entries,(size_type)local_c0);
      __x = std::vector<int,_std::allocator<int>_>::at(&pvVar5->shared_identifiers,local_f0);
      std::vector<int,_std::allocator<int>_>::push_back(&pvVar8->shared_identifiers,__x);
      pvVar8 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (local_68,(size_type)local_c0);
      local_f4 = 0;
      std::vector<int,_std::allocator<int>_>::push_back(&pvVar8->shared_numerators,&local_f4);
      local_f0 = local_f0 + 1;
    }
    local_c0 = (CHPageOffset *)
               ((long)&(local_c0->entries).
                       super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

void
QPDF::calculateHPageOffset(QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    // Page Offset Hint Table

    // We are purposely leaving some values set to their initial zero values.

    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    size_t npages = pages.size();
    CHPageOffset& cph = m->c_page_offset_data;
    std::vector<CHPageOffsetEntry>& cphe = cph.entries;

    // Calculate minimum and maximum values for number of objects per page and page length.

    int min_nobjects = cphe.at(0).nobjects;
    int max_nobjects = min_nobjects;
    int min_length = outputLengthNextN(pages.at(0).getObjectID(), min_nobjects, new_obj, obj);
    int max_length = min_length;
    int max_shared = cphe.at(0).nshared_objects;

    HPageOffset& ph = m->page_offset_hints;
    std::vector<HPageOffsetEntry>& phe = ph.entries;
    // npages is the size of the existing pages array.
    phe = std::vector<HPageOffsetEntry>(npages);

    for (unsigned int i = 0; i < npages; ++i) {
        // Calculate values for each page, assigning full values to the delta items.  They will be
        // adjusted later.

        // Repeat calculations for page 0 so we can assign to phe[i] without duplicating those
        // assignments.

        int nobjects = cphe.at(i).nobjects;
        int length = outputLengthNextN(pages.at(i).getObjectID(), nobjects, new_obj, obj);
        int nshared = cphe.at(i).nshared_objects;

        min_nobjects = std::min(min_nobjects, nobjects);
        max_nobjects = std::max(max_nobjects, nobjects);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        max_shared = std::max(max_shared, nshared);

        phe.at(i).delta_nobjects = nobjects;
        phe.at(i).delta_page_length = length;
        phe.at(i).nshared_objects = nshared;
    }

    ph.min_nobjects = min_nobjects;
    ph.first_page_offset = new_obj[obj[pages.at(0)].renumber].xref.getOffset();
    ph.nbits_delta_nobjects = nbits(max_nobjects - min_nobjects);
    ph.min_page_length = min_length;
    ph.nbits_delta_page_length = nbits(max_length - min_length);
    ph.nbits_nshared_objects = nbits(max_shared);
    ph.nbits_shared_identifier = nbits(m->c_shared_object_data.nshared_total);
    ph.shared_denominator = 4; // doesn't matter

    // It isn't clear how to compute content offset and content length.  Since we are not
    // interleaving page objects with the content stream, we'll use the same values for content
    // length as page length.  We will use 0 as content offset because this is what Adobe does
    // (implementation note 127) and pdlin as well.
    ph.nbits_delta_content_length = ph.nbits_delta_page_length;
    ph.min_content_length = ph.min_page_length;

    for (size_t i = 0; i < npages; ++i) {
        // Adjust delta entries
        if ((phe.at(i).delta_nobjects < min_nobjects) ||
            (phe.at(i).delta_page_length < min_length)) {
            stopOnError(
                "found too small delta nobjects or delta page length while writing "
                "linearization data");
        }
        phe.at(i).delta_nobjects -= min_nobjects;
        phe.at(i).delta_page_length -= min_length;
        phe.at(i).delta_content_length = phe.at(i).delta_page_length;

        for (size_t j = 0; j < toS(cphe.at(i).nshared_objects); ++j) {
            phe.at(i).shared_identifiers.push_back(cphe.at(i).shared_identifiers.at(j));
            phe.at(i).shared_numerators.push_back(0);
        }
    }
}